

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O2

void __thiscall
Centaurus::CompositeATN<unsigned_char>::build_wildcard_departure_set
          (CompositeATN<unsigned_char> *this,CATNDepartureSetFactory<unsigned_char> *deptset_factory
          ,Identifier *id,int color,PriorityChain *priority,ATNStateStack *stack)

{
  Identifier *id_00;
  __type _Var1;
  int iVar2;
  CATNNode<unsigned_char> *pCVar3;
  SimpleException *this_00;
  CATNMachine<unsigned_char> *this_01;
  __node_base *p_Var4;
  int index;
  allocator local_8d;
  int local_8c;
  vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  *local_88;
  CompositeATN<unsigned_char> *local_80;
  CATNDepartureSetFactory<unsigned_char> *local_78;
  PriorityChain *local_70;
  CATNMachine<unsigned_char> *local_68;
  __node_base *local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_58;
  undefined1 local_50 [32];
  
  local_58 = &id->m_id;
  local_88 = &stack->
              super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ;
  p_Var4 = &(this->m_dict)._M_h._M_before_begin;
  local_8c = color;
  local_80 = this;
  local_78 = deptset_factory;
  local_70 = priority;
  do {
    p_Var4 = p_Var4->_M_nxt;
    if (p_Var4 == (__node_base *)0x0) {
      return;
    }
    this_01 = (CATNMachine<unsigned_char> *)(p_Var4 + 6);
    id_00 = (Identifier *)(p_Var4 + 1);
    local_68 = this_01;
    local_60 = p_Var4;
    for (index = 0; index < (int)(((long)p_Var4[8]._M_nxt - (long)p_Var4[7]._M_nxt) / 0x50);
        index = index + 1) {
      pCVar3 = CATNMachine<unsigned_char>::operator[](this_01,index);
      _Var1 = std::operator==(&(pCVar3->m_submachine).m_id,local_58);
      if (_Var1) {
        iVar2 = ATNPath::count(stack,id_00,index);
        if (1 < iVar2) {
          this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string((string *)local_50,"Upward sentinel reached.",&local_8d);
          SimpleException::SimpleException(this_00,(string *)local_50);
          __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
        }
        ATNPath::push(stack,id_00,index);
        ATNPath::ATNPath((ATNPath *)local_50,id_00,index);
        build_departure_set_r(local_80,local_78,(ATNPath *)local_50,local_8c,local_70,stack);
        std::
        vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
        ::~vector((vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                   *)(local_50 + 8));
        std::
        vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
        ::pop_back(local_88);
        this_01 = local_68;
        p_Var4 = local_60;
      }
    }
  } while( true );
}

Assistant:

void CompositeATN<TCHAR>::build_wildcard_departure_set(CATNDepartureSetFactory<TCHAR>& deptset_factory, const Identifier& id, int color, const PriorityChain& priority, ATNStateStack& stack) const
{
    for (const auto& p : m_dict)
    {
        for (int i = 0; i < p.second.get_num_nodes(); i++)
        {
            if (p.second[i].get_submachine() == id)
            {
                if (stack.count(p.first, i) >= 2)
                {
                    //std::cout << "Upward sentinel reached." << std::endl;
                    throw SimpleException("Upward sentinel reached.");
                    //continue;
                }
                stack.push(p.first, i);
                build_departure_set_r(deptset_factory, ATNPath(p.first, i), color, priority, stack);
                stack.pop();
            }
        }
    }
}